

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

DescriptorCache * __thiscall
DescriptorCache::MergeAndDiff(DescriptorCache *this,DescriptorCache *other)

{
  bool bVar1;
  allocator<char> *__a;
  runtime_error *prVar2;
  DescriptorCache *in_RDI;
  long in_FS_OFFSET;
  pair<const_unsigned_int,_CExtPubKey> *lh_xpub_pair;
  ExtPubKeyMap *__range1_2;
  value_type *derived_xpub_pair;
  unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
  *__range2;
  pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>
  *derived_xpub_map_pair;
  unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
  *__range1_1;
  pair<const_unsigned_int,_CExtPubKey> *parent_xpub_pair;
  ExtPubKeyMap *__range1;
  DescriptorCache *diff;
  iterator __end1_2;
  iterator __begin1_2;
  const_iterator __end2;
  const_iterator __begin2;
  iterator __end1_1;
  iterator __begin1_1;
  iterator __end1;
  iterator __begin1;
  CExtPubKey xpub_2;
  CExtPubKey xpub_1;
  CExtPubKey xpub;
  DescriptorCache *in_stack_fffffffffffffbd8;
  DescriptorCache *in_stack_fffffffffffffbe0;
  CExtPubKey *in_stack_fffffffffffffbe8;
  DescriptorCache *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint32_t in_stack_fffffffffffffbf8;
  undefined2 in_stack_fffffffffffffbfc;
  undefined1 in_stack_fffffffffffffbfe;
  undefined1 in_stack_fffffffffffffbff;
  CExtPubKey *in_stack_fffffffffffffc00;
  DescriptorCache *in_stack_fffffffffffffc08;
  allocator<char> *in_stack_fffffffffffffc18;
  char *in_stack_fffffffffffffc20;
  char *__s;
  undefined6 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2e;
  undefined1 in_stack_fffffffffffffc2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_329 [2];
  _Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> local_2d8;
  _Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> local_2d0;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
  local_2c8;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
  local_2c0;
  char local_279;
  _Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> local_278;
  _Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> local_270;
  string local_210 [184];
  string local_158 [184];
  string local_a0 [152];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  DescriptorCache(in_stack_fffffffffffffbd8);
  GetCachedParentExtPubKeys(in_stack_fffffffffffffbe0);
  local_270._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
       ::begin((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                *)in_stack_fffffffffffffbe0);
  local_278._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
       ::end((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
              *)in_stack_fffffffffffffbe0);
  while (bVar1 = std::__detail::operator==
                           ((_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *
                            )in_stack_fffffffffffffbe8,
                            (_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *
                            )in_stack_fffffffffffffbe0), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
    operator*((_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false> *)
              in_stack_fffffffffffffbd8);
    CExtPubKey::CExtPubKey((CExtPubKey *)in_stack_fffffffffffffbd8);
    in_stack_fffffffffffffc2f =
         GetCachedParentExtPubKey
                   ((DescriptorCache *)
                    CONCAT17(in_stack_fffffffffffffbff,
                             CONCAT16(in_stack_fffffffffffffbfe,
                                      CONCAT24(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8))
                            ),(uint32_t)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                    (CExtPubKey *)in_stack_fffffffffffffbf0);
    if ((bool)in_stack_fffffffffffffc2f) {
      in_stack_fffffffffffffc2e =
           ::operator!=(in_stack_fffffffffffffbe8,(CExtPubKey *)in_stack_fffffffffffffbe0);
      if ((bool)in_stack_fffffffffffffc2e) {
        __a = (allocator<char> *)__cxa_allocate_exception(0x10);
        __s = &local_279;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc2f,
                            CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)),__s,__a);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
        std::runtime_error::runtime_error((runtime_error *)__a,local_a0);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(__a,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_019d803a;
      }
    }
    else {
      CacheParentExtPubKey
                (in_stack_fffffffffffffbf0,
                 CONCAT13(in_stack_fffffffffffffbff,
                          CONCAT12(in_stack_fffffffffffffbfe,in_stack_fffffffffffffbfc)),
                 in_stack_fffffffffffffbe8);
      CacheParentExtPubKey
                (in_stack_fffffffffffffbf0,
                 CONCAT13(in_stack_fffffffffffffbff,
                          CONCAT12(in_stack_fffffffffffffbfe,in_stack_fffffffffffffbfc)),
                 in_stack_fffffffffffffbe8);
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false> *)
               in_stack_fffffffffffffbd8);
  }
  std::
  unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                    *)in_stack_fffffffffffffbd8);
  GetCachedDerivedExtPubKeys(in_stack_fffffffffffffbe0);
  local_2c0._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
       ::begin(&in_stack_fffffffffffffbe0->m_derived_xpubs);
  local_2c8._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
       ::end(&in_stack_fffffffffffffbe0->m_derived_xpubs);
  while (bVar1 = std::__detail::operator==
                           ((_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
                             *)in_stack_fffffffffffffbe8,
                            (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>
                             *)in_stack_fffffffffffffbe0), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
    ::operator*((_Node_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
                 *)in_stack_fffffffffffffbd8);
    local_2d0._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
         ::begin((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                  *)in_stack_fffffffffffffbe0);
    local_2d8._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
         ::end((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                *)in_stack_fffffffffffffbe0);
    while (bVar1 = std::__detail::operator==
                             ((_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                               *)in_stack_fffffffffffffbe8,
                              (_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false>
                               *)in_stack_fffffffffffffbe0), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::__detail::_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
      operator*((_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false> *)
                in_stack_fffffffffffffbd8);
      CExtPubKey::CExtPubKey((CExtPubKey *)in_stack_fffffffffffffbd8);
      bVar1 = GetCachedDerivedExtPubKey
                        (in_stack_fffffffffffffc08,(uint32_t)((ulong)in_RDI >> 0x20),
                         (uint32_t)in_RDI,in_stack_fffffffffffffc00);
      if (bVar1) {
        bVar1 = ::operator!=(in_stack_fffffffffffffbe8,(CExtPubKey *)in_stack_fffffffffffffbe0);
        if (bVar1) {
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc2f,
                              CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)),
                     in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
          std::runtime_error::runtime_error(prVar2,local_158);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_019d803a;
        }
      }
      else {
        CacheDerivedExtPubKey
                  (in_stack_fffffffffffffbf0,
                   CONCAT13(in_stack_fffffffffffffbff,
                            CONCAT12(in_stack_fffffffffffffbfe,in_stack_fffffffffffffbfc)),
                   in_stack_fffffffffffffbf8,in_stack_fffffffffffffbe8);
        CacheDerivedExtPubKey
                  (in_stack_fffffffffffffbf0,
                   CONCAT13(in_stack_fffffffffffffbff,
                            CONCAT12(in_stack_fffffffffffffbfe,in_stack_fffffffffffffbfc)),
                   in_stack_fffffffffffffbf8,in_stack_fffffffffffffbe8);
      }
      std::__detail::_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
      operator++((_Node_const_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false> *)
                 in_stack_fffffffffffffbd8);
    }
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false,_false>
                  *)in_stack_fffffffffffffbd8);
  }
  std::
  unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
  ::~unordered_map(&in_stack_fffffffffffffbd8->m_derived_xpubs);
  GetCachedLastHardenedExtPubKeys(in_stack_fffffffffffffbe0);
  local_329[0]._9_8_ =
       std::
       unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
       ::begin((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                *)in_stack_fffffffffffffbe0);
  local_329[0]._1_8_ =
       std::
       unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
       ::end((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
              *)in_stack_fffffffffffffbe0);
  do {
    bVar1 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *)
                       in_stack_fffffffffffffbe8,
                       (_Node_iterator_base<std::pair<const_unsigned_int,_CExtPubKey>,_false> *)
                       in_stack_fffffffffffffbe0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
      ::~unordered_map((unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>
                        *)in_stack_fffffffffffffbd8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return in_RDI;
      }
LAB_019d803a:
      __stack_chk_fail();
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
    operator*((_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false> *)
              in_stack_fffffffffffffbd8);
    CExtPubKey::CExtPubKey((CExtPubKey *)in_stack_fffffffffffffbd8);
    in_stack_fffffffffffffbff =
         GetCachedLastHardenedExtPubKey
                   ((DescriptorCache *)
                    CONCAT17(in_stack_fffffffffffffbff,
                             CONCAT16(in_stack_fffffffffffffbfe,
                                      CONCAT24(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8))
                            ),(uint32_t)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                    (CExtPubKey *)in_stack_fffffffffffffbf0);
    if ((bool)in_stack_fffffffffffffbff) {
      in_stack_fffffffffffffbfe =
           ::operator!=(in_stack_fffffffffffffbe8,(CExtPubKey *)in_stack_fffffffffffffbe0);
      if ((bool)in_stack_fffffffffffffbfe) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        __lhs = local_329;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc2f,
                            CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)),
                   in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        std::operator+(__lhs,(char *)prVar2);
        std::runtime_error::runtime_error(prVar2,local_210);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_019d803a;
      }
    }
    else {
      CacheLastHardenedExtPubKey
                (in_stack_fffffffffffffbf0,
                 CONCAT13(in_stack_fffffffffffffbff,
                          CONCAT12(in_stack_fffffffffffffbfe,in_stack_fffffffffffffbfc)),
                 in_stack_fffffffffffffbe8);
      CacheLastHardenedExtPubKey
                (in_stack_fffffffffffffbf0,
                 CONCAT13(in_stack_fffffffffffffbff,
                          CONCAT12(in_stack_fffffffffffffbfe,in_stack_fffffffffffffbfc)),
                 in_stack_fffffffffffffbe8);
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_unsigned_int,_CExtPubKey>,_false,_false> *)
               in_stack_fffffffffffffbd8);
  } while( true );
}

Assistant:

DescriptorCache DescriptorCache::MergeAndDiff(const DescriptorCache& other)
{
    DescriptorCache diff;
    for (const auto& parent_xpub_pair : other.GetCachedParentExtPubKeys()) {
        CExtPubKey xpub;
        if (GetCachedParentExtPubKey(parent_xpub_pair.first, xpub)) {
            if (xpub != parent_xpub_pair.second) {
                throw std::runtime_error(std::string(__func__) + ": New cached parent xpub does not match already cached parent xpub");
            }
            continue;
        }
        CacheParentExtPubKey(parent_xpub_pair.first, parent_xpub_pair.second);
        diff.CacheParentExtPubKey(parent_xpub_pair.first, parent_xpub_pair.second);
    }
    for (const auto& derived_xpub_map_pair : other.GetCachedDerivedExtPubKeys()) {
        for (const auto& derived_xpub_pair : derived_xpub_map_pair.second) {
            CExtPubKey xpub;
            if (GetCachedDerivedExtPubKey(derived_xpub_map_pair.first, derived_xpub_pair.first, xpub)) {
                if (xpub != derived_xpub_pair.second) {
                    throw std::runtime_error(std::string(__func__) + ": New cached derived xpub does not match already cached derived xpub");
                }
                continue;
            }
            CacheDerivedExtPubKey(derived_xpub_map_pair.first, derived_xpub_pair.first, derived_xpub_pair.second);
            diff.CacheDerivedExtPubKey(derived_xpub_map_pair.first, derived_xpub_pair.first, derived_xpub_pair.second);
        }
    }
    for (const auto& lh_xpub_pair : other.GetCachedLastHardenedExtPubKeys()) {
        CExtPubKey xpub;
        if (GetCachedLastHardenedExtPubKey(lh_xpub_pair.first, xpub)) {
            if (xpub != lh_xpub_pair.second) {
                throw std::runtime_error(std::string(__func__) + ": New cached last hardened xpub does not match already cached last hardened xpub");
            }
            continue;
        }
        CacheLastHardenedExtPubKey(lh_xpub_pair.first, lh_xpub_pair.second);
        diff.CacheLastHardenedExtPubKey(lh_xpub_pair.first, lh_xpub_pair.second);
    }
    return diff;
}